

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

float __thiscall indk::Position::getDistanceFrom(Position *this,Position *P)

{
  Error *this_00;
  uint i;
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if (this->DimensionsCount != P->DimensionsCount) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  fVar2 = 0.0;
  for (uVar1 = 0; this->DimensionsCount != uVar1; uVar1 = uVar1 + 1) {
    fVar3 = this->X[uVar1] - P->X[uVar1];
    fVar2 = fVar2 + fVar3 * fVar3;
  }
  if (0.0 <= fVar2) {
    return SQRT(fVar2);
  }
  fVar2 = sqrtf(fVar2);
  return fVar2;
}

Assistant:

float indk::Position::getDistanceFrom(const indk::Position *P) {
    if (DimensionsCount != P->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    float D = 0, CValue;
    for (unsigned int i = 0; i < DimensionsCount; i++) {
        CValue = X[i] - P -> getPositionValue(i);
        D += CValue * CValue;
    }
    return sqrt(D);
}